

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

int classify_keyword(char *start,char *end,int flags)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong in_R8;
  byte *pbVar6;
  byte bVar7;
  byte bVar8;
  
  lVar5 = (long)end - (long)start;
  if (lVar5 == 4) {
    pcVar2 = "beta";
    pbVar6 = (byte *)start;
    for (lVar3 = 4; lVar3 != 0; lVar3 = lVar3 + -1) {
      bVar1 = *pbVar6;
      bVar7 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar7 = bVar1;
      }
      bVar1 = *pcVar2;
      bVar8 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar8 = bVar1;
      }
      if (bVar7 != bVar8) {
        in_R8 = (ulong)((uint)bVar7 - (uint)bVar8);
        goto LAB_0010148a;
      }
      pbVar6 = pbVar6 + 1;
      pcVar2 = (char *)((byte *)pcVar2 + 1);
    }
    in_R8 = 0;
LAB_0010148a:
    iVar4 = (int)in_R8;
joined_r0x0010148d:
    if (iVar4 == 0) {
      return 1;
    }
  }
  else if (lVar5 == 5) {
    pcVar2 = "alpha";
    pbVar6 = (byte *)start;
    for (in_R8 = 5; in_R8 != 0; in_R8 = in_R8 - 1) {
      bVar1 = *pbVar6;
      bVar7 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar7 = bVar1;
      }
      bVar1 = *pcVar2;
      bVar8 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar8 = bVar1;
      }
      if (bVar7 != bVar8) {
        iVar4 = (uint)bVar7 - (uint)bVar8;
        goto joined_r0x0010148d;
      }
      pbVar6 = pbVar6 + 1;
      pcVar2 = (char *)((byte *)pcVar2 + 1);
    }
    iVar4 = 0;
    goto joined_r0x0010148d;
  }
  if (lVar5 == 2) {
    pcVar2 = "rc";
    pbVar6 = (byte *)start;
    for (lVar3 = 2; lVar3 != 0; lVar3 = lVar3 + -1) {
      bVar1 = *pbVar6;
      bVar7 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar7 = bVar1;
      }
      bVar1 = *pcVar2;
      bVar8 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar8 = bVar1;
      }
      if (bVar7 != bVar8) {
        in_R8 = (ulong)((uint)bVar7 - (uint)bVar8);
        goto LAB_00101505;
      }
      pbVar6 = pbVar6 + 1;
      pcVar2 = (char *)((byte *)pcVar2 + 1);
    }
    in_R8 = 0;
LAB_00101505:
    if ((int)in_R8 == 0) {
      return 1;
    }
  }
  if (2 < lVar5) {
    pcVar2 = "pre";
    pbVar6 = (byte *)start;
    for (lVar3 = 3; lVar3 != 0; lVar3 = lVar3 + -1) {
      bVar1 = *pbVar6;
      bVar7 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar7 = bVar1;
      }
      bVar1 = *pcVar2;
      bVar8 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar8 = bVar1;
      }
      if (bVar7 != bVar8) {
        in_R8 = (ulong)((uint)bVar7 - (uint)bVar8);
        goto LAB_00101580;
      }
      pbVar6 = pbVar6 + 1;
      pcVar2 = (char *)((byte *)pcVar2 + 1);
    }
    in_R8 = 0;
LAB_00101580:
    if ((int)in_R8 == 0) {
      return 1;
    }
  }
  if (lVar5 < 4) {
LAB_0010160a:
    if (4 < lVar5) {
      pcVar2 = "patch";
      pbVar6 = (byte *)start;
      for (lVar3 = 5; lVar3 != 0; lVar3 = lVar3 + -1) {
        bVar1 = *pbVar6;
        bVar7 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar7 = bVar1;
        }
        bVar1 = *pcVar2;
        bVar8 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar8 = bVar1;
        }
        if (bVar7 != bVar8) {
          in_R8 = (ulong)((uint)bVar7 - (uint)bVar8);
          goto LAB_0010167c;
        }
        pbVar6 = pbVar6 + 1;
        pcVar2 = (char *)((byte *)pcVar2 + 1);
      }
      in_R8 = 0;
LAB_0010167c:
      if ((int)in_R8 == 0) goto LAB_0010179b;
    }
    if (lVar5 == 2) {
      pcVar2 = "pl";
      pbVar6 = (byte *)start;
      for (lVar3 = 2; lVar3 != 0; lVar3 = lVar3 + -1) {
        bVar1 = *pbVar6;
        bVar7 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar7 = bVar1;
        }
        bVar1 = *pcVar2;
        bVar8 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar8 = bVar1;
        }
        if (bVar7 != bVar8) {
          in_R8 = (ulong)((uint)bVar7 - (uint)bVar8);
          goto LAB_001016f7;
        }
        pbVar6 = pbVar6 + 1;
        pcVar2 = (char *)((byte *)pcVar2 + 1);
      }
      in_R8 = 0;
LAB_001016f7:
      if ((int)in_R8 == 0) goto LAB_0010179b;
    }
    if (lVar5 == 6) {
      lVar3 = 6;
      pcVar2 = "errata";
      pbVar6 = (byte *)start;
      do {
        if (lVar3 == 0) {
          iVar4 = 0;
          break;
        }
        bVar1 = *pbVar6;
        bVar7 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar7 = bVar1;
        }
        bVar1 = *pcVar2;
        bVar8 = bVar1 | 0x20;
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          bVar8 = bVar1;
        }
        if (bVar7 == bVar8) {
          pbVar6 = pbVar6 + 1;
          pcVar2 = (char *)((byte *)pcVar2 + 1);
          lVar3 = lVar3 + -1;
        }
        else {
          in_R8 = (ulong)((uint)bVar7 - (uint)bVar8);
        }
        iVar4 = (int)in_R8;
      } while (bVar7 == bVar8);
      if (iVar4 == 0) goto LAB_0010179b;
    }
    iVar4 = 0;
    if (lVar5 == 1 && (flags & 1U) != 0) {
      iVar4 = (uint)((*start + 0xb0U & 0xdf) == 0) * 2;
    }
  }
  else {
    pcVar2 = "post";
    pbVar6 = (byte *)start;
    for (lVar3 = 4; lVar3 != 0; lVar3 = lVar3 + -1) {
      bVar1 = *pbVar6;
      bVar7 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar7 = bVar1;
      }
      bVar1 = *pcVar2;
      bVar8 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar8 = bVar1;
      }
      if (bVar7 != bVar8) {
        in_R8 = (ulong)((uint)bVar7 - (uint)bVar8);
        goto LAB_00101601;
      }
      pbVar6 = pbVar6 + 1;
      pcVar2 = (char *)((byte *)pcVar2 + 1);
    }
    in_R8 = 0;
LAB_00101601:
    if ((int)in_R8 != 0) goto LAB_0010160a;
LAB_0010179b:
    iVar4 = 2;
  }
  return iVar4;
}

Assistant:

static int classify_keyword(const char* start, const char* end, int flags) {
	if (end - start == 5 && my_memcasecmp(start, "alpha", 5) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start == 4 && my_memcasecmp(start, "beta", 4) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start == 2 && my_memcasecmp(start, "rc", 2) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start >= 3 && my_memcasecmp(start, "pre", 3) == 0)
		return KEYWORD_PRE_RELEASE;
	else if (end - start >= 4 && my_memcasecmp(start, "post", 4) == 0)
		return KEYWORD_POST_RELEASE;
	else if (end - start >= 5 && my_memcasecmp(start, "patch", 5) == 0)
		return KEYWORD_POST_RELEASE;
	else if (end - start == 2 && my_memcasecmp(start, "pl", 2) == 0)  /* patchlevel */
		return KEYWORD_POST_RELEASE;
	else if (end - start == 6 && my_memcasecmp(start, "errata", 6) == 0)
		return KEYWORD_POST_RELEASE;
	else if (flags & VERSIONFLAG_P_IS_PATCH && end - start == 1 && (*start == 'p' || *start == 'P'))
		return KEYWORD_POST_RELEASE;

	return KEYWORD_UNKNOWN;
}